

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

UnaryOp wasm::Abstract::getUnary(Type type,Op op)

{
  BasicType BVar1;
  Type TStack_18;
  Op op_local;
  Type type_local;
  
  TStack_18.id = type.id;
  BVar1 = wasm::Type::getBasic(&stack0xffffffffffffffe8);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    type_local.id._4_4_ = InvalidUnary;
    break;
  case i32:
    if (op == Popcnt) {
      type_local.id._4_4_ = PopcntInt32;
    }
    else if (op == EqZ) {
      type_local.id._4_4_ = EqZInt32;
    }
    else {
      type_local.id._4_4_ = InvalidUnary;
    }
    break;
  case i64:
    if (op == Popcnt) {
      type_local.id._4_4_ = PopcntInt64;
    }
    else if (op == EqZ) {
      type_local.id._4_4_ = EqZInt64;
    }
    else {
      type_local.id._4_4_ = InvalidUnary;
    }
    break;
  case f32:
    if (op == Abs) {
      type_local.id._4_4_ = AbsFloat32;
    }
    else if (op == Neg) {
      type_local.id._4_4_ = NegFloat32;
    }
    else {
      type_local.id._4_4_ = InvalidUnary;
    }
    break;
  case f64:
    if (op == Abs) {
      type_local.id._4_4_ = AbsFloat64;
    }
    else if (op == Neg) {
      type_local.id._4_4_ = NegFloat64;
    }
    else {
      type_local.id._4_4_ = InvalidUnary;
    }
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/abstract.h"
                       ,0x85);
  }
  return type_local.id._4_4_;
}

Assistant:

inline UnaryOp getUnary(Type type, Op op) {
  switch (type.getBasic()) {
    case Type::i32: {
      switch (op) {
        case EqZ:
          return EqZInt32;
        case Popcnt:
          return PopcntInt32;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::i64: {
      switch (op) {
        case EqZ:
          return EqZInt64;
        case Popcnt:
          return PopcntInt64;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::f32: {
      switch (op) {
        case Abs:
          return AbsFloat32;
        case Neg:
          return NegFloat32;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::f64: {
      switch (op) {
        case Abs:
          return AbsFloat64;
        case Neg:
          return NegFloat64;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::v128:
    case Type::none:
    case Type::unreachable: {
      return InvalidUnary;
    }
  }
  WASM_UNREACHABLE("invalid type");
}